

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int archive_read_format_cpio_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  int64_t iVar4;
  cpio *cpio;
  ssize_t bytes_read;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  bytes_read = (ssize_t)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)buff;
  buff_local = (void **)a;
  if (*(long *)((long)pvVar1 + 0x20) != 0) {
    __archive_read_consume(a,*(int64_t *)((long)pvVar1 + 0x20));
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x18) < 1) {
    lVar2 = *(long *)((long)pvVar1 + 0x30);
    iVar4 = __archive_read_consume((archive_read *)buff_local,*(int64_t *)((long)pvVar1 + 0x30));
    if (lVar2 == iVar4) {
      *(undefined8 *)((long)pvVar1 + 0x30) = 0;
      *size_local = 0;
      *offset_local = 0;
      *(undefined8 *)bytes_read = *(undefined8 *)((long)pvVar1 + 0x28);
      a_local._4_4_ = 1;
    }
    else {
      a_local._4_4_ = -0x1e;
    }
  }
  else {
    pvVar3 = __archive_read_ahead((archive_read *)buff_local,1,(ssize_t *)&cpio);
    *size_local = (size_t)pvVar3;
    if ((long)cpio < 1) {
      a_local._4_4_ = -0x1e;
    }
    else {
      if (*(long *)((long)pvVar1 + 0x18) < (long)cpio) {
        cpio = *(cpio **)((long)pvVar1 + 0x18);
      }
      *offset_local = (int64_t)cpio;
      *(cpio **)((long)pvVar1 + 0x20) = cpio;
      *(undefined8 *)bytes_read = *(undefined8 *)((long)pvVar1 + 0x28);
      *(long *)((long)pvVar1 + 0x28) = (long)&cpio->magic + *(long *)((long)pvVar1 + 0x28);
      *(long *)((long)pvVar1 + 0x18) = *(long *)((long)pvVar1 + 0x18) - (long)cpio;
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_cpio_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	ssize_t bytes_read;
	struct cpio *cpio;

	cpio = (struct cpio *)(a->format->data);

	if (cpio->entry_bytes_unconsumed) {
		__archive_read_consume(a, cpio->entry_bytes_unconsumed);
		cpio->entry_bytes_unconsumed = 0;
	}

	if (cpio->entry_bytes_remaining > 0) {
		*buff = __archive_read_ahead(a, 1, &bytes_read);
		if (bytes_read <= 0)
			return (ARCHIVE_FATAL);
		if (bytes_read > cpio->entry_bytes_remaining)
			bytes_read = (ssize_t)cpio->entry_bytes_remaining;
		*size = bytes_read;
		cpio->entry_bytes_unconsumed = bytes_read;
		*offset = cpio->entry_offset;
		cpio->entry_offset += bytes_read;
		cpio->entry_bytes_remaining -= bytes_read;
		return (ARCHIVE_OK);
	} else {
		if (cpio->entry_padding !=
			__archive_read_consume(a, cpio->entry_padding)) {
			return (ARCHIVE_FATAL);
		}
		cpio->entry_padding = 0;
		*buff = NULL;
		*size = 0;
		*offset = cpio->entry_offset;
		return (ARCHIVE_EOF);
	}
}